

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O0

bool __thiscall QMenuPrivate::considerAction(QMenuPrivate *this,QAction *action)

{
  int iVar1;
  QMenu *pQVar2;
  ulong uVar3;
  QStyle *pQVar4;
  long in_RSI;
  QMenuPrivate *in_RDI;
  QMenu *q;
  QWidget *in_stack_ffffffffffffffd8;
  
  pQVar2 = q_func(in_RDI);
  if ((in_RSI != 0) && (uVar3 = QAction::isSeparator(), (uVar3 & 1) == 0)) {
    uVar3 = QAction::isEnabled();
    if ((uVar3 & 1) == 0) {
      pQVar4 = QWidget::style(in_stack_ffffffffffffffd8);
      iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0xe,0,pQVar2);
      return iVar1 != 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool considerAction(const QAction *action) const
    {
        Q_Q(const QMenu);
        if (!action || action->isSeparator())
            return false;
        if (action->isEnabled())
            return true;
        return q->style()->styleHint(QStyle::SH_Menu_AllowActiveAndDisabled, nullptr, q);
    }